

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CovarianceMatrix.cpp
# Opt level: O1

void __thiscall CovarianceMatrix::modelToQueries(CovarianceMatrix *this)

{
  pointer *pppAVar1;
  pointer *pppVar2;
  pointer *pppQVar3;
  pointer *ppbVar4;
  _WordT *p_Var5;
  iterator iVar6;
  iterator iVar7;
  QueryCompiler *pQVar8;
  bool bVar9;
  Function *pFVar10;
  Aggregate *pAVar11;
  Query *pQVar12;
  Query **__args;
  size_t sVar13;
  var_bitset *pvVar14;
  ulong uVar15;
  iterator iVar16;
  ulong uVar17;
  QueryCompiler *pQVar18;
  ulong uVar19;
  QueryCompiler *pQVar20;
  vector<Query*,std::allocator<Query*>> *this_00;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  Query *linear;
  Aggregate *agg_quad;
  Query *quad;
  Query *count;
  Aggregate *agg_count;
  Aggregate *agg_linear;
  prod_bitset prod_linear_v1;
  prod_bitset prod_quad_v1;
  size_t featureToFunction [100];
  size_t quadFeatureToFunction [100];
  Query *local_968;
  vector<Query*,std::allocator<Query*>> *local_960;
  ulong local_958;
  Query *local_950;
  element_type *local_948;
  var_bitset *local_940;
  Query *local_938;
  Query *local_930;
  Aggregate *local_928;
  size_t local_920;
  bitset<1500UL> local_918;
  bitset<1500UL> local_858;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_798;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_768;
  bitset<1500UL> local_738;
  ulong auStack_678 [100];
  ulong auStack_358 [101];
  
  this_00 = (vector<Query*,std::allocator<Query*>> *)&(this->super_Application)._features;
  pvVar14 = &this->_categoricalFeatures;
  uVar17 = 0;
  sVar13 = 0;
  local_960 = this_00;
  local_940 = pvVar14;
  do {
    bVar9 = std::bitset<100UL>::test((bitset<100UL> *)this_00,sVar13);
    if ((bVar9) && (bVar9 = std::bitset<100UL>::test(pvVar14,sVar13), !bVar9)) {
      local_948 = (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      local_958 = uVar17;
      pFVar10 = (Function *)operator_new(0x48);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_858;
      local_858.super__Base_bitset<24UL>._M_w[0] = sVar13;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &local_768,__l,(less<unsigned_long> *)&local_738,(allocator_type *)&local_918);
      Function::Function(pFVar10,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                  *)&local_768,sum);
      QueryCompiler::addFunction(local_948,pFVar10);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_768);
      auStack_678[sVar13] = local_958;
      uVar17 = local_958 + 1;
      this_00 = local_960;
      pvVar14 = local_940;
    }
    sVar13 = sVar13 + 1;
  } while (sVar13 != 100);
  sVar13 = 0;
  do {
    bVar9 = std::bitset<100UL>::test((bitset<100UL> *)this_00,sVar13);
    if ((bVar9) && (bVar9 = std::bitset<100UL>::test(pvVar14,sVar13), !bVar9)) {
      local_948 = (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      local_958 = uVar17;
      pFVar10 = (Function *)operator_new(0x48);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_858;
      local_858.super__Base_bitset<24UL>._M_w[0] = sVar13;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &local_798,__l_00,(less<unsigned_long> *)&local_738,(allocator_type *)&local_918);
      Function::Function(pFVar10,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                  *)&local_798,quadratic_sum);
      QueryCompiler::addFunction(local_948,pFVar10);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_798);
      auStack_358[sVar13] = local_958;
      uVar17 = local_958 + 1;
      this_00 = local_960;
      pvVar14 = local_940;
    }
    sVar13 = sVar13 + 1;
  } while (sVar13 != 100);
  pAVar11 = (Aggregate *)operator_new(0x30);
  (pAVar11->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar11->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar11->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pAVar11->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar11->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar11->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_928 = pAVar11;
  memset(&local_858,0,0xc0);
  iVar6._M_current =
       (pAVar11->_agg).
       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (pAVar11->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
    _M_realloc_insert<std::bitset<1500ul>>
              ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar11,iVar6,
               &local_858);
  }
  else {
    memset(iVar6._M_current,0,0xc0);
    (pAVar11->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
  }
  local_930 = (Query *)operator_new(0x30);
  (local_930->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (local_930->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (local_930->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_930->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_930->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7._M_current =
       (local_930->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (local_930->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
              ((vector<Aggregate*,std::allocator<Aggregate*>> *)&local_930->_aggregates,iVar7,
               &local_928);
  }
  else {
    *iVar7._M_current = local_928;
    pppAVar1 = &(local_930->_aggregates).
                super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  local_930->_rootID =
       ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
       ->_id;
  QueryCompiler::addQuery
            ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_930);
  local_960 = (vector<Query*,std::allocator<Query*>> *)&this->listOfQueries;
  iVar16._M_current =
       (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Query*,std::allocator<Query*>>::_M_realloc_insert<Query*const&>
              (local_960,iVar16,&local_930);
  }
  else {
    *iVar16._M_current = local_930;
    pppQVar3 = &(this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppQVar3 = *pppQVar3 + 1;
  }
  local_920 = ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_root->_id;
  pQVar18 = (QueryCompiler *)0x1;
  pvVar14 = (var_bitset *)0x0;
  do {
    uVar17 = (ulong)pvVar14 >> 6;
    local_958 = 1L << ((byte)pvVar14 & 0x3f);
    if (((this->super_Application)._features.super__Base_bitset<2UL>._M_w[uVar17] >>
         ((ulong)pvVar14 & 0x3f) & 1) != 0) {
      memset(&local_858,0,0xc0);
      memset(&local_738,0,0xc0);
      if (((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[uVar17] & local_958) == 0) {
        uVar15 = auStack_678[(long)pvVar14];
        if (0x5db < uVar15) {
LAB_00197c7f:
          std::__throw_out_of_range_fmt
                    ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar15,
                     0x5dc);
        }
        p_Var5 = local_858.super__Base_bitset<24UL>._M_w + (uVar15 >> 6);
        *p_Var5 = *p_Var5 | 1L << ((byte)uVar15 & 0x3f);
        pAVar11 = (Aggregate *)operator_new(0x30);
        (pAVar11->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pAVar11->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pAVar11->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pAVar11->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pAVar11->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pAVar11->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar6._M_current =
             (pAVar11->_agg).
             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_918.super__Base_bitset<24UL>._M_w[0] = (_WordT)pAVar11;
        if (iVar6._M_current ==
            (pAVar11->_agg).
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
          _M_realloc_insert<std::bitset<1500ul>const&>
                    ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar11,
                     iVar6,&local_858);
        }
        else {
          memcpy(iVar6._M_current,&local_858,0xc0);
          (pAVar11->_agg).
          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        local_968 = (Query *)operator_new(0x30);
        (local_968->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (local_968->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (local_968->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_968->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_968->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar7._M_current =
             (local_968->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (local_968->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                    ((vector<Aggregate*,std::allocator<Aggregate*>> *)&local_968->_aggregates,iVar7,
                     (Aggregate **)&local_918);
        }
        else {
          *iVar7._M_current = (Aggregate *)local_918.super__Base_bitset<24UL>._M_w[0];
          pppAVar1 = &(local_968->_aggregates).
                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppAVar1 = *pppAVar1 + 1;
        }
        local_968->_rootID = local_920;
        QueryCompiler::addQuery
                  ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_968);
        iVar16._M_current =
             (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar16._M_current ==
            (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Query*,std::allocator<Query*>>::_M_realloc_insert<Query*const&>
                    (local_960,iVar16,&local_968);
        }
        else {
          *iVar16._M_current = local_968;
          pppQVar3 = &(this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppQVar3 = *pppQVar3 + 1;
        }
        uVar15 = auStack_358[(long)pvVar14];
        if (0x5db < uVar15) goto LAB_00197c7f;
        p_Var5 = local_738.super__Base_bitset<24UL>._M_w + (uVar15 >> 6);
        *p_Var5 = *p_Var5 | 1L << ((byte)uVar15 & 0x3f);
        pQVar12 = (Query *)operator_new(0x30);
        (((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)&pQVar12->_rootID)->
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pQVar12->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (pQVar12->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)&(pQVar12->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>)
        ->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
        (((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)&(pQVar12->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>)
        ->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
        (((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)&(pQVar12->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>)
        ->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar6._M_current = (bitset<1500UL> *)(pQVar12->_fVars).super__Base_bitset<2UL>._M_w[0];
        local_950 = pQVar12;
        if (iVar6._M_current == (bitset<1500UL> *)(pQVar12->_fVars).super__Base_bitset<2UL>._M_w[1])
        {
          std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
          _M_realloc_insert<std::bitset<1500ul>const&>
                    ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pQVar12,
                     iVar6,&local_738);
        }
        else {
          memcpy(iVar6._M_current,&local_738,0xc0);
          (pQVar12->_fVars).super__Base_bitset<2UL>._M_w[0] = (_WordT)(iVar6._M_current + 1);
        }
        local_938 = (Query *)operator_new(0x30);
        (local_938->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (local_938->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (local_938->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_938->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_938->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar7._M_current =
             (local_938->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (local_938->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                    ((vector<Aggregate*,std::allocator<Aggregate*>> *)&local_938->_aggregates,iVar7,
                     (Aggregate **)&local_950);
        }
        else {
          *iVar7._M_current = (Aggregate *)local_950;
          pppAVar1 = &(local_938->_aggregates).
                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppAVar1 = *pppAVar1 + 1;
        }
        local_938->_rootID =
             ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_root->_id;
        QueryCompiler::addQuery
                  ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_938);
        iVar16._M_current =
             (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pQVar12 = local_938;
        if (iVar16._M_current !=
            (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00197a73;
        __args = &local_938;
LAB_00197a8a:
        std::vector<Query*,std::allocator<Query*>>::_M_realloc_insert<Query*const&>
                  (local_960,iVar16,__args);
      }
      else {
        pAVar11 = (Aggregate *)operator_new(0x30);
        (pAVar11->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pAVar11->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pAVar11->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pAVar11->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pAVar11->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pAVar11->_incoming).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar6._M_current =
             (pAVar11->_agg).
             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_918.super__Base_bitset<24UL>._M_w[0] = (_WordT)pAVar11;
        if (iVar6._M_current ==
            (pAVar11->_agg).
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
          _M_realloc_insert<std::bitset<1500ul>const&>
                    ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar11,
                     iVar6,&local_858);
        }
        else {
          memset(iVar6._M_current,0,0xc0);
          (pAVar11->_agg).
          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        local_968 = (Query *)operator_new(0x30);
        (local_968->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (local_968->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (local_968->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_968->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_968->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar7._M_current =
             (local_968->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (local_968->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                    ((vector<Aggregate*,std::allocator<Aggregate*>> *)&local_968->_aggregates,iVar7,
                     (Aggregate **)&local_918);
        }
        else {
          *iVar7._M_current = (Aggregate *)local_918.super__Base_bitset<24UL>._M_w[0];
          pppAVar1 = &(local_968->_aggregates).
                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppAVar1 = *pppAVar1 + 1;
        }
        p_Var5 = (local_968->_fVars).super__Base_bitset<2UL>._M_w + uVar17;
        *p_Var5 = *p_Var5 | local_958;
        local_968->_rootID = this->_queryRootIndex[(long)pvVar14];
        QueryCompiler::addQuery
                  ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_968);
        iVar16._M_current =
             (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pQVar12 = local_968;
        __args = &local_968;
        if (iVar16._M_current ==
            (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00197a8a;
LAB_00197a73:
        *iVar16._M_current = pQVar12;
        pppQVar3 = &(this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppQVar3 = *pppQVar3 + 1;
      }
      pQVar20 = pQVar18;
      local_948 = pQVar18;
      local_940 = pvVar14;
      if (pvVar14 < (var_bitset *)0x63) {
        do {
          uVar19 = (ulong)pQVar20 >> 6;
          uVar15 = 1L << ((byte)pQVar20 & 0x3f);
          if (((this->super_Application)._features.super__Base_bitset<2UL>._M_w[uVar19] >>
               ((ulong)pQVar20 & 0x3f) & 1) != 0) {
            memcpy(&local_918,&local_858,0xc0);
            pQVar12 = (Query *)operator_new(0x30);
            pQVar12->_rootID = 0;
            (pQVar12->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
            (pQVar12->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
            (pQVar12->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pQVar12->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pQVar12->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_968 = pQVar12;
            local_950 = (Query *)operator_new(0x30);
            (local_950->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
            (local_950->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
            (((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)&(local_950->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>)->_M_impl).
            super__Vector_impl_data._M_start = (pointer)0x0;
            (((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)&(local_950->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>)->_M_impl).
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)&(local_950->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>)->_M_impl).
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             &local_950->_rootID)->
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((this->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->_root->_id;
            if (((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[uVar17] & local_958) != 0
               ) {
              (((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
               &local_950->_rootID)->
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)this->_queryRootIndex[(long)local_940];
              ppbVar4 = (pointer *)((local_950->_fVars).super__Base_bitset<2UL>._M_w + uVar17);
              *ppbVar4 = (pointer)((ulong)*ppbVar4 | local_958);
            }
            if (((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[uVar19] & uVar15) == 0) {
              uVar15 = auStack_678[(long)pQVar20];
              if (0x5db < uVar15) goto LAB_00197c7f;
              p_Var5 = local_918.super__Base_bitset<24UL>._M_w + (uVar15 >> 6);
              *p_Var5 = *p_Var5 | 1L << ((byte)uVar15 & 0x3f);
            }
            else {
              ppbVar4 = (pointer *)((local_950->_fVars).super__Base_bitset<2UL>._M_w + uVar19);
              *ppbVar4 = (pointer)((ulong)*ppbVar4 | uVar15);
              (((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
               &local_950->_rootID)->
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)this->_queryRootIndex[(long)pQVar20];
            }
            iVar6._M_current = (bitset<1500UL> *)(pQVar12->_fVars).super__Base_bitset<2UL>._M_w[0];
            if (iVar6._M_current ==
                (bitset<1500UL> *)(pQVar12->_fVars).super__Base_bitset<2UL>._M_w[1]) {
              std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
              _M_realloc_insert<std::bitset<1500ul>const&>
                        ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pQVar12,
                         iVar6,&local_918);
            }
            else {
              memcpy(iVar6._M_current,&local_918,0xc0);
              (pQVar12->_fVars).super__Base_bitset<2UL>._M_w[0] = (_WordT)(iVar6._M_current + 1);
            }
            iVar7._M_current =
                 (Aggregate **)
                 (((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)&(local_950->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>)->_M_impl).
                 super__Vector_impl_data._M_finish;
            if ((pointer)iVar7._M_current ==
                (((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)&(local_950->_aggregates).
                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>)->_M_impl).
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Aggregate*,std::allocator<Aggregate*>>::
              _M_realloc_insert<Aggregate*const&>
                        ((vector<Aggregate*,std::allocator<Aggregate*>> *)&local_950->_aggregates,
                         iVar7,(Aggregate **)&local_968);
            }
            else {
              *iVar7._M_current = (Aggregate *)local_968;
              pppVar2 = &(((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            *)&(local_950->_aggregates).
                               super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>)->
                         _M_impl).super__Vector_impl_data._M_finish;
              *pppVar2 = (pointer)&(*pppVar2)->second;
            }
            QueryCompiler::addQuery
                      ((this->_compiler).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       local_950);
            iVar16._M_current =
                 (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
            if (iVar16._M_current ==
                (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Query*,std::allocator<Query*>>::_M_realloc_insert<Query*const&>
                        (local_960,iVar16,&local_950);
            }
            else {
              *iVar16._M_current = local_950;
              pppQVar3 = &(this->listOfQueries).
                          super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppQVar3 = *pppQVar3 + 1;
            }
          }
          pQVar8 = pQVar20 + -1;
          pvVar14 = local_940;
          pQVar18 = local_948;
          pQVar20 = (QueryCompiler *)
                    ((long)&(pQVar20->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    + 1);
        } while ((undefined1 *)((long)&(pQVar8->_viewCache)._M_h._M_single_bucket + 7U) <
                 (undefined1 *)0x62);
      }
    }
    pvVar14 = (var_bitset *)((long)(pvVar14->super__Base_bitset<2UL>)._M_w + 1);
    pQVar18 = (QueryCompiler *)
              ((long)&(pQVar18->_td).
                      super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1);
    if (pvVar14 == (var_bitset *)0x64) {
      return;
    }
  } while( true );
}

Assistant:

void CovarianceMatrix::modelToQueries()
{
    size_t numberOfFunctions = 0;
    size_t featureToFunction[NUM_OF_VARIABLES],
        quadFeatureToFunction[NUM_OF_VARIABLES];
    
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_features.test(var) && !_categoricalFeatures.test(var))
        {
            _compiler->addFunction(
                new Function({var}, Operation::sum));
            featureToFunction[var] = numberOfFunctions;
            numberOfFunctions++;
        }
    }

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_features.test(var) && !_categoricalFeatures.test(var))
        {
            _compiler->addFunction(
                new Function({var}, Operation::quadratic_sum));
            quadFeatureToFunction[var] = numberOfFunctions;
            numberOfFunctions++;
        }
    }

    Aggregate* agg_count = new Aggregate();
    agg_count->_agg.push_back(prod_bitset());
            
    Query* count = new Query();
    count->_aggregates.push_back(agg_count);
    count->_rootID = _td->_root->_id;
    _compiler->addQuery(count);
    listOfQueries.push_back(count);    
    
    size_t numberOfQueries = 0;
    size_t cont_var_root = _td->_root->_id;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features[var])
            continue;
        
        prod_bitset prod_linear_v1;
        prod_bitset prod_quad_v1;

        if (!_categoricalFeatures[var])
        {
            // Linear function per Feature 
            prod_linear_v1.set(featureToFunction[var]);
 
            Aggregate* agg_linear = new Aggregate();
            agg_linear->_agg.push_back(prod_linear_v1);
            
            Query* linear = new Query();
            linear->_aggregates.push_back(agg_linear);
            linear->_rootID = cont_var_root;

            _compiler->addQuery(linear);
            
            listOfQueries.push_back(linear);            
            ++numberOfQueries;            
            
            // Quadratic function for each feature
            prod_quad_v1.set(quadFeatureToFunction[var]);
            
            Aggregate* agg_quad = new Aggregate();
            agg_quad->_agg.push_back(prod_quad_v1);
            
            Query* quad = new Query();
            quad->_aggregates.push_back(agg_quad);
            quad->_rootID = _td->_root->_id; // cont_var_root;

            _compiler->addQuery(quad);
            
            listOfQueries.push_back(quad);
            ++numberOfQueries;
        }
        else
        {
            Aggregate* agg_linear = new Aggregate();
            agg_linear->_agg.push_back(prod_linear_v1);
            
            Query* linear = new Query();
            linear->_aggregates.push_back(agg_linear);
            linear->_fVars.set(var);
            linear->_rootID = _queryRootIndex[var];
            _compiler->addQuery(linear);

            listOfQueries.push_back(linear);
            ++numberOfQueries;
        }
        

        for (size_t var2 = var+1; var2 < NUM_OF_VARIABLES; ++var2)
        {
            if (_features[var2])
            {
                //*****************************************//
                prod_bitset prod_quad_v2 = prod_linear_v1;
                
                Aggregate* agg_quad_v2 = new Aggregate();
                
                Query* quad_v2 = new Query();
                quad_v2->_rootID = _td->_root->_id;

                // if (_categoricalFeatures[var])
                // {
                //     quad_v2->_rootID = _queryRootIndex[var];
                //     quad_v2->_fVars.set(var);
                //     if (_categoricalFeatures[var2])
                //     {
                //         quad_v2->_fVars.set(var2);
                //         // If both varaibles are categoricalVars - we choose the
                //         // var2 as the root
                //         // TODO: We should use the root that is highest to the
                //         // original root
                //         if (_queryRootIndex[var2] <= _queryRootIndex[var])
                //             quad_v2->_rootID = _queryRootIndex[var2];
                //     }
                //     else
                //     {
                //         prod_quad_v2.set(featureToFunction[var2]);
                //     }
                // }
                // else if (_categoricalFeatures[var2])
                // {
                //     quad_v2->_fVars.set(var2);
                //     quad_v2->_rootID = _queryRootIndex[var2];
                // }
                // else
                // {
                //     // create prod_quad_v2 of both var and var2
                //     prod_quad_v2.set(featureToFunction[var2]);                    
                // }
                if (_categoricalFeatures[var])
                {
                    quad_v2->_rootID = _queryRootIndex[var];
                    quad_v2->_fVars.set(var);                    
                }
                
                if (_categoricalFeatures[var2])
                {
                    quad_v2->_fVars.set(var2);
                    // If both varaibles are categoricalVars - we choose the
                    // var2 as the root
                    quad_v2->_rootID = _queryRootIndex[var2];
                }
                else
                {
                    // create prod_quad_v2 of both var and var2
                    prod_quad_v2.set(featureToFunction[var2]);                    
                }
                
                agg_quad_v2->_agg.push_back(prod_quad_v2);
                
                quad_v2->_aggregates.push_back(agg_quad_v2);
                _compiler->addQuery(quad_v2);
                
                // TODO: Here we add both sides! multiply var times param of
                // var2 -- add that to gradient of var. And then multiply var2
                // times param of var and add to gradient of var2! -- this can
                // be done togther in one pass over the vector!

                listOfQueries.push_back(quad_v2);                
                ++numberOfQueries;
                // TODO: once we have identified the queries and how they are
                // multiplied, we then need to identify the actual views that
                // are computed over and use the information group computation
                // over this view!
            }
        }
    }
}